

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmyblas2.c
# Opt level: O0

void clsolve(int ldm,int ncol,singlecomplex *M,singlecomplex *rhs)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  singlecomplex sVar4;
  singlecomplex sVar5;
  singlecomplex sVar6;
  singlecomplex sVar7;
  float *pfVar8;
  singlecomplex *psVar9;
  singlecomplex *psVar10;
  singlecomplex *psVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float ci_12;
  float cr_12;
  float ci_11;
  float cr_11;
  float ci_10;
  float cr_10;
  float ci_9;
  float cr_9;
  float ci_8;
  float cr_8;
  float ci_7;
  float cr_7;
  float ci_6;
  float cr_6;
  float ci_5;
  float cr_5;
  float ci_4;
  float cr_4;
  float ci_3;
  float cr_3;
  float ci_2;
  float cr_2;
  float ci_1;
  float cr_1;
  float ci;
  float cr;
  int firstcol;
  singlecomplex *Mki3;
  singlecomplex *Mki2;
  singlecomplex *Mki1;
  singlecomplex *Mki0;
  singlecomplex *M0;
  singlecomplex temp;
  singlecomplex x3;
  singlecomplex x2;
  singlecomplex x1;
  singlecomplex x0;
  int k;
  singlecomplex *rhs_local;
  singlecomplex *M_local;
  int ncol_local;
  int ldm_local;
  
  ci = 0.0;
  Mki0 = M;
  while ((int)ci < ncol + -3) {
    psVar9 = Mki0 + 1;
    psVar10 = psVar9 + (long)ldm + 1;
    psVar11 = psVar10 + (long)ldm + 1;
    x1.r = rhs[(int)ci].r;
    x1.i = rhs[(int)ci].i;
    fVar12 = rhs[(int)ci + 1].r - (x1.r * psVar9->r + -(x1.i * Mki0[1].i));
    fVar13 = rhs[(int)ci + 1].i - (x1.i * psVar9->r + x1.r * Mki0[1].i);
    fVar14 = (rhs[(int)ci + 2].r - (x1.r * Mki0[2].r + -(x1.i * Mki0[2].i))) -
             (fVar12 * psVar10->r + -(fVar13 * psVar9[(long)ldm + 1].i));
    fVar15 = (rhs[(int)ci + 2].i - (x1.i * Mki0[2].r + x1.r * Mki0[2].i)) -
             (fVar13 * psVar10->r + fVar12 * psVar9[(long)ldm + 1].i);
    Mki1 = Mki0 + 4;
    Mki2 = psVar9 + (long)ldm + 3;
    Mki3 = psVar10 + (long)ldm + 2;
    fVar16 = ((rhs[(int)ci + 3].r - (x1.r * Mki0[3].r + -(x1.i * Mki0[3].i))) -
             (fVar12 * psVar9[(long)ldm + 2].r + -(fVar13 * psVar9[(long)ldm + 2].i))) -
             (fVar14 * psVar11->r + -(fVar15 * psVar10[(long)ldm + 1].i));
    fVar17 = ((rhs[(int)ci + 3].i - (x1.i * Mki0[3].r + x1.r * Mki0[3].i)) -
             (fVar13 * psVar9[(long)ldm + 2].r + fVar12 * psVar9[(long)ldm + 2].i)) -
             (fVar15 * psVar11->r + fVar14 * psVar10[(long)ldm + 1].i);
    sVar6.i = fVar13;
    sVar6.r = fVar12;
    rhs[(int)ci + 1] = sVar6;
    sVar5.i = fVar15;
    sVar5.r = fVar14;
    rhs[(int)ci + 2] = sVar5;
    sVar4.i = fVar17;
    sVar4.r = fVar16;
    rhs[(int)ci + 3] = sVar4;
    ci = (float)((int)ci + 4);
    psVar9 = psVar11 + ldm;
    for (x0.r = ci; _cr = psVar9 + 1, (int)x0.r < ncol; x0.r = (float)((int)x0.r + 1)) {
      pfVar8 = &Mki1->r;
      pfVar1 = &Mki1->i;
      fVar2 = Mki1->r;
      fVar3 = Mki1->i;
      Mki1 = Mki1 + 1;
      rhs[(int)x0.r].r = rhs[(int)x0.r].r - (x1.r * *pfVar8 + -(x1.i * *pfVar1));
      rhs[(int)x0.r].i = rhs[(int)x0.r].i - (x1.i * fVar2 + x1.r * fVar3);
      pfVar8 = &Mki2->r;
      pfVar1 = &Mki2->i;
      fVar2 = Mki2->r;
      fVar3 = Mki2->i;
      Mki2 = Mki2 + 1;
      rhs[(int)x0.r].r = rhs[(int)x0.r].r - (fVar12 * *pfVar8 + -(fVar13 * *pfVar1));
      rhs[(int)x0.r].i = rhs[(int)x0.r].i - (fVar13 * fVar2 + fVar12 * fVar3);
      pfVar8 = &Mki3->r;
      pfVar1 = &Mki3->i;
      fVar2 = Mki3->r;
      fVar3 = Mki3->i;
      Mki3 = Mki3 + 1;
      rhs[(int)x0.r].r = rhs[(int)x0.r].r - (fVar14 * *pfVar8 + -(fVar15 * *pfVar1));
      rhs[(int)x0.r].i = rhs[(int)x0.r].i - (fVar15 * fVar2 + fVar14 * fVar3);
      fVar2 = _cr->r;
      fVar3 = psVar9[1].i;
      rhs[(int)x0.r].r = rhs[(int)x0.r].r - (fVar16 * _cr->r + -(fVar17 * psVar9[1].i));
      rhs[(int)x0.r].i = rhs[(int)x0.r].i - (fVar17 * fVar2 + fVar16 * fVar3);
      psVar9 = _cr;
    }
    Mki0 = Mki0 + (ldm * 4 + 4);
  }
  if ((int)ci < ncol + -1) {
    psVar9 = Mki0 + 1;
    x1.r = rhs[(int)ci].r;
    x1.i = rhs[(int)ci].i;
    Mki1 = Mki0 + 2;
    fVar12 = rhs[(int)ci + 1].r - (x1.r * psVar9->r + -(x1.i * Mki0[1].i));
    fVar13 = rhs[(int)ci + 1].i - (x1.i * psVar9->r + x1.r * Mki0[1].i);
    sVar7.i = fVar13;
    sVar7.r = fVar12;
    rhs[(int)ci + 1] = sVar7;
    psVar9 = psVar9 + ldm;
    for (x0.r = (float)((int)ci + 2); Mki2 = psVar9 + 1, (int)x0.r < ncol;
        x0.r = (float)((int)x0.r + 1)) {
      pfVar8 = &Mki1->r;
      pfVar1 = &Mki1->i;
      fVar14 = Mki1->r;
      fVar15 = Mki1->i;
      Mki1 = Mki1 + 1;
      rhs[(int)x0.r].r = rhs[(int)x0.r].r - (x1.r * *pfVar8 + -(x1.i * *pfVar1));
      rhs[(int)x0.r].i = rhs[(int)x0.r].i - (x1.i * fVar14 + x1.r * fVar15);
      fVar14 = Mki2->r;
      fVar15 = psVar9[1].i;
      rhs[(int)x0.r].r = rhs[(int)x0.r].r - (fVar12 * Mki2->r + -(fVar13 * psVar9[1].i));
      rhs[(int)x0.r].i = rhs[(int)x0.r].i - (fVar13 * fVar14 + fVar12 * fVar15);
      psVar9 = Mki2;
    }
  }
  return;
}

Assistant:

void clsolve ( int ldm, int ncol, singlecomplex *M, singlecomplex *rhs )
{
    int k;
    singlecomplex x0, x1, x2, x3, temp;
    singlecomplex *M0;
    singlecomplex *Mki0, *Mki1, *Mki2, *Mki3;
    register int firstcol = 0;

    M0 = &M[0];


    while ( firstcol < ncol - 3 ) { /* Do 4 columns */
      	Mki0 = M0 + 1;
      	Mki1 = Mki0 + ldm + 1;
      	Mki2 = Mki1 + ldm + 1;
      	Mki3 = Mki2 + ldm + 1;

      	x0 = rhs[firstcol];
      	cc_mult(&temp, &x0, Mki0); Mki0++;
      	c_sub(&x1, &rhs[firstcol+1], &temp);
      	cc_mult(&temp, &x0, Mki0); Mki0++;
	c_sub(&x2, &rhs[firstcol+2], &temp);
	cc_mult(&temp, &x1, Mki1); Mki1++;
	c_sub(&x2, &x2, &temp);
      	cc_mult(&temp, &x0, Mki0); Mki0++;
	c_sub(&x3, &rhs[firstcol+3], &temp);
	cc_mult(&temp, &x1, Mki1); Mki1++;
	c_sub(&x3, &x3, &temp);
	cc_mult(&temp, &x2, Mki2); Mki2++;
	c_sub(&x3, &x3, &temp);

 	rhs[++firstcol] = x1;
      	rhs[++firstcol] = x2;
      	rhs[++firstcol] = x3;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    cc_mult(&temp, &x0, Mki0); Mki0++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x1, Mki1); Mki1++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x2, Mki2); Mki2++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x3, Mki3); Mki3++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	}

        M0 += 4 * ldm + 4;
    }

    if ( firstcol < ncol - 1 ) { /* Do 2 columns */
        Mki0 = M0 + 1;
        Mki1 = Mki0 + ldm + 1;

        x0 = rhs[firstcol];
	cc_mult(&temp, &x0, Mki0); Mki0++;
	c_sub(&x1, &rhs[firstcol+1], &temp);

      	rhs[++firstcol] = x1;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    cc_mult(&temp, &x0, Mki0); Mki0++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x1, Mki1); Mki1++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	} 
    }
    
}